

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O3

void __thiscall Graph::defineModifiables(Graph *this)

{
  int *piVar1;
  int iVar2;
  Vertex *pVVar3;
  Vertex *pVVar4;
  Vertex *pVVar5;
  Vertex *pVVar6;
  int iVar7;
  Edge *pEVar8;
  Edge *pEVar9;
  int iVar10;
  
  pVVar3 = this->verticesList;
  for (pVVar4 = pVVar3; pVVar4 != (Vertex *)0x0; pVVar4 = pVVar4->nextVertex) {
    for (pEVar9 = pVVar4->edgesList; pEVar9 != (Edge *)0x0; pEVar9 = pEVar9->nextEdge) {
      pEVar9->modifiable = true;
    }
  }
  iVar2 = this->edgesSize;
  iVar10 = 1;
  if (1 < iVar2) {
    iVar7 = 0;
    pVVar4 = pVVar3;
    do {
      for (; pVVar4 != (Vertex *)0x0; pVVar4 = pVVar4->nextVertex) {
        for (pEVar9 = pVVar4->edgesList; pEVar9 != (Edge *)0x0; pEVar9 = pEVar9->nextEdge) {
          pVVar5 = pEVar9->destiny;
          if (((pVVar5->auxDegree == 1) && (pEVar9->closed == true)) && (pEVar9->modifiable == true)
             ) {
            pEVar9->modifiable = false;
            pEVar9->closed = true;
            pVVar6 = pEVar9->origin;
            pEVar8 = findEdge(this,pVVar5->id,pVVar6->id);
            pEVar8->modifiable = false;
            piVar1 = &pVVar6->auxDegree;
            *piVar1 = *piVar1 + -1;
            pVVar5->auxDegree = pVVar5->auxDegree + -1;
            iVar10 = iVar10 + 1;
          }
        }
      }
      iVar7 = iVar7 + 1;
      pVVar4 = pVVar3;
    } while (iVar7 != iVar2 / 2);
  }
  this->numberOfNonModifiable = iVar10;
  return;
}

Assistant:

void Graph::defineModifiables(){

    this->resetModifiables();//define todos os arcos como sendo modificaveis
    int n=1;
    for(int i=0; i<this->edgesSize/2; i++){

        //procura arcos que conectam nos folha, esses arcos nao sao modificaveis(nao podem ser abertos)
        for(Vertex *no=this->verticesList; no!=NULL; no= no->getNext()){
            for(Edge *e= no->getEdgesList(); e!=NULL; e= e->getNext()){

                if(e->getDestiny()->getAuxDegree()==1 && e->isClosed()==true && e->getModifiable()==true){

//                    printf("\ndefinindo como nao modif A{%d}...", a->getID());

                    e->setModifiable(false);
		    e->setSwitch(true);//nao modificavel: chave sempre fechad

                    Edge *e_reverse = this->findEdge(e->getDestiny()->getID(), e->getOrigin()->getID());
                    e_reverse->setModifiable(false);

                    e->getOrigin()->setAuxDegree(e->getOrigin()->getAuxDegree() - 1);
                    e->getDestiny()->setAuxDegree(e->getDestiny()->getAuxDegree() - 1);

//                  printf("Modificaveis definidos!");

                    n++;
                }
            }
        }
    }
    this->numberOfNonModifiable = n;
//    printf("\ndefiniu arestas modificaveis!");
}